

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O0

int Cec_ManSimAnalyzeOutputs(Cec_ManSim_t *p)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  uint *p1;
  void **ppvVar4;
  int i_00;
  int local_2c;
  int i;
  uint *pInfo2;
  uint *pInfo;
  Cec_ManSim_t *p_local;
  
  if (p->pPars->fCheckMiter == 0) {
    p_local._4_4_ = 0;
  }
  else {
    if (p->vCoSimInfo == (Vec_Ptr_t *)0x0) {
      __assert_fail("p->vCoSimInfo != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecClass.c"
                    ,0x24e,"int Cec_ManSimAnalyzeOutputs(Cec_ManSim_t *)");
    }
    if (p->pPars->fDualOut == 0) {
      for (local_2c = 0; iVar2 = Gia_ManPoNum(p->pAig), local_2c < iVar2; local_2c = local_2c + 1) {
        puVar3 = (uint *)Vec_PtrEntry(p->vCoSimInfo,local_2c);
        iVar2 = Cec_ManSimCompareConst(puVar3,p->nWords);
        if (iVar2 == 0) {
          if (p->iOut == -1) {
            p->iOut = local_2c;
            iVar2 = Cec_ManSimCompareConstFirstBit(puVar3,p->nWords);
            Cec_ManSimSavePattern(p,iVar2);
          }
          if (p->pCexes == (void **)0x0) {
            iVar2 = Gia_ManPoNum(p->pAig);
            ppvVar4 = (void **)calloc((long)iVar2,8);
            p->pCexes = ppvVar4;
          }
          if (p->pCexes[local_2c] == (void *)0x0) {
            p->nOuts = p->nOuts + 1;
            p->pCexes[local_2c] = (void *)0x1;
          }
        }
      }
    }
    else {
      uVar1 = Gia_ManPoNum(p->pAig);
      if ((uVar1 & 1) != 0) {
        __assert_fail("(Gia_ManPoNum(p->pAig) & 1) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecClass.c"
                      ,0x252,"int Cec_ManSimAnalyzeOutputs(Cec_ManSim_t *)");
      }
      for (local_2c = 0; iVar2 = Gia_ManPoNum(p->pAig), local_2c < iVar2; local_2c = local_2c + 2) {
        puVar3 = (uint *)Vec_PtrEntry(p->vCoSimInfo,local_2c);
        i_00 = local_2c + 1;
        p1 = (uint *)Vec_PtrEntry(p->vCoSimInfo,i_00);
        iVar2 = Cec_ManSimCompareEqual(puVar3,p1,p->nWords);
        if (iVar2 == 0) {
          if (p->iOut == -1) {
            p->iOut = i_00 / 2;
            iVar2 = Cec_ManSimCompareEqualFirstBit(puVar3,p1,p->nWords);
            Cec_ManSimSavePattern(p,iVar2);
          }
          if (p->pCexes == (void **)0x0) {
            iVar2 = Gia_ManPoNum(p->pAig);
            ppvVar4 = (void **)calloc((long)(iVar2 / 2),8);
            p->pCexes = ppvVar4;
          }
          if (p->pCexes[i_00 / 2] == (void *)0x0) {
            p->nOuts = p->nOuts + 1;
            p->pCexes[i_00 / 2] = (void *)0x1;
          }
        }
      }
    }
    p_local._4_4_ = (uint)(p->pCexes != (void **)0x0);
  }
  return p_local._4_4_;
}

Assistant:

int Cec_ManSimAnalyzeOutputs( Cec_ManSim_t * p )
{
    unsigned * pInfo, * pInfo2;
    int i;
    if ( !p->pPars->fCheckMiter )
        return 0;
    assert( p->vCoSimInfo != NULL );
    // compare outputs with 0
    if ( p->pPars->fDualOut )
    {
        assert( (Gia_ManPoNum(p->pAig) & 1) == 0 );
        for ( i = 0; i < Gia_ManPoNum(p->pAig); i++ )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, i );
            pInfo2 = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, ++i );
            if ( !Cec_ManSimCompareEqual( pInfo, pInfo2, p->nWords ) )
            {
                if ( p->iOut == -1 )
                {
                    p->iOut = i/2;
                    Cec_ManSimSavePattern( p, Cec_ManSimCompareEqualFirstBit(pInfo, pInfo2, p->nWords) );
                }
                if ( p->pCexes == NULL )
                    p->pCexes = ABC_CALLOC( void *, Gia_ManPoNum(p->pAig)/2 );
                if ( p->pCexes[i/2] == NULL )
                {
                    p->nOuts++;
                    p->pCexes[i/2] = (void *)1;
                }
            }
        }
    }
    else
    {
        for ( i = 0; i < Gia_ManPoNum(p->pAig); i++ )
        {
            pInfo = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, i );
            if ( !Cec_ManSimCompareConst( pInfo, p->nWords ) )
            {
                if ( p->iOut == -1 )
                {
                    p->iOut = i;
                    Cec_ManSimSavePattern( p, Cec_ManSimCompareConstFirstBit(pInfo, p->nWords) );
                }
                if ( p->pCexes == NULL )
                    p->pCexes = ABC_CALLOC( void *, Gia_ManPoNum(p->pAig) );
                if ( p->pCexes[i] == NULL )
                {
                    p->nOuts++;
                    p->pCexes[i] = (void *)1;
                }
            }
        }
    }
    return p->pCexes != NULL;
}